

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyEnvironment.cpp
# Opt level: O1

WasmConstLitNode __thiscall
Js::WebAssemblyEnvironment::GetGlobalValue(WebAssemblyEnvironment *this,WasmGlobal *global)

{
  WriteBarrierPtr<void> *pWVar1;
  WriteBarrierPtr<void> *pWVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined8 in_RAX;
  undefined4 *puVar6;
  WasmConstLitNode WVar7;
  undefined8 local_28;
  
  if (global == (WasmGlobal *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyEnvironment.cpp"
                                ,0x99,"(global)","global");
    if (!bVar4) goto LAB_00d993d1;
    *puVar6 = 0;
  }
  uVar5 = WebAssemblyModule::GetOffsetForGlobal((this->module).ptr,global);
  local_28._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  switch(global->m_type) {
  case FirstLocalType:
    pWVar2 = (this->start).ptr;
    puVar6 = (undefined4 *)((long)&pWVar2->ptr + (ulong)uVar5 * 4);
    if (((long)puVar6 < (long)pWVar2) || ((long)(this->end).ptr < (long)(puVar6 + 1))) {
LAB_00d99377:
      Throw::InternalError();
    }
    local_28 = (void *)CONCAT44(local_28._4_4_,*puVar6);
    break;
  case I64:
  case F64:
    pWVar1 = (this->start).ptr;
    pWVar2 = pWVar1 + uVar5;
    if (((long)pWVar2 < (long)pWVar1) || ((long)(this->end).ptr < (long)(pWVar2 + 1)))
    goto LAB_00d99377;
    local_28 = pWVar2->ptr;
    break;
  case F32:
    pWVar2 = (this->start).ptr;
    puVar6 = (undefined4 *)((long)&pWVar2->ptr + (ulong)uVar5 * 4);
    if (((long)puVar6 < (long)pWVar2) || ((long)(this->end).ptr < (long)(puVar6 + 1)))
    goto LAB_00d99377;
    local_28 = (void *)CONCAT44(local_28._4_4_,*puVar6);
    break;
  case V128:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyEnvironment.cpp"
                                ,0xa4,"((0))","Wasm.Simd globals not supported");
    if (!bVar4) {
LAB_00d993d1:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  default:
    Wasm::WasmTypes::
    CompileAssertCases<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
              ();
  }
  WVar7.field_0._8_8_ = &switchD_00d99300::switchdataD_01199c4c;
  WVar7.field_0.f64 = (double)local_28;
  return (WasmConstLitNode)WVar7.field_0;
}

Assistant:

Wasm::WasmConstLitNode WebAssemblyEnvironment::GetGlobalValue(Wasm::WasmGlobal* global) const
{
    AssertOrFailFast(global);
    Wasm::WasmConstLitNode cnst;
    uint32 offset = module->GetOffsetForGlobal(global);

    switch (global->GetType())
    {
    case Wasm::WasmTypes::I32: cnst.i32 = GetGlobalInternal<int>(offset); break;
    case Wasm::WasmTypes::I64: cnst.i64 = GetGlobalInternal<int64>(offset); break;
    case Wasm::WasmTypes::F32: cnst.f32 = GetGlobalInternal<float>(offset); break;
    case Wasm::WasmTypes::F64: cnst.f64 = GetGlobalInternal<double>(offset); break;
#ifdef ENABLE_WASM_SIMD
    case Wasm::WasmTypes::V128: AssertOrFailFastMsg(UNREACHED, "Wasm.Simd globals not supported");
#endif
    default:
        Wasm::WasmTypes::CompileAssertCases<Wasm::WasmTypes::I32, Wasm::WasmTypes::I64, Wasm::WasmTypes::F32, Wasm::WasmTypes::F64, WASM_V128_CHECK_TYPE>();
    }
    return cnst;
}